

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::clear
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,bool dispose)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  
  if (0 < (this->heap).sz) {
    piVar2 = (this->heap).data;
    piVar3 = (this->indices).map.data;
    lVar4 = 0;
    do {
      iVar1 = piVar2[lVar4];
      if ((this->indices).map.sz <= iVar1) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,
                      "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      piVar3[iVar1] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->heap).sz);
  }
  piVar2 = (this->heap).data;
  if ((piVar2 != (int *)0x0) && ((this->heap).sz = 0, dispose)) {
    free(piVar2);
    (this->heap).data = (int *)0x0;
    (this->heap).cap = 0;
  }
  return;
}

Assistant:

void clear(bool dispose = false) 
    { 
        // TODO: shouldn't the 'indices' map also be dispose-cleared?
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dispose); 
    }